

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

uint statehash(config *a)

{
  uint uVar1;
  
  uVar1 = 0;
  if (a != (config *)0x0) {
    do {
      uVar1 = a->rp->index * 0x25 + uVar1 * 0x23b + a->dot;
      a = a->bp;
    } while (a != (config *)0x0);
  }
  return uVar1;
}

Assistant:

PRIVATE unsigned statehash(struct config *a)
{
  unsigned h=0;
  while( a ){
    h = h*571 + a->rp->index*37 + a->dot;
    a = a->bp;
  }
  return h;
}